

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall
CLIntercept::checkRemoveAcceleratorInfo(CLIntercept *this,cl_accelerator_intel accelerator)

{
  mutex *__mutex;
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  int iVar3;
  cl_int cVar4;
  _Base_ptr p_Var5;
  _Rb_tree_header *p_Var6;
  mapped_type *pmVar7;
  undefined8 uVar8;
  _Base_ptr p_Var9;
  iterator __position;
  cl_uint refCount;
  undefined1 local_50 [32];
  
  __mutex = &this->m_Mutex;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 == 0) {
    p_Var1 = &(this->m_AcceleratorInfoMap)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = (this->m_AcceleratorInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var5 = &p_Var1->_M_header;
    for (; p_Var2 != (_Base_ptr)0x0;
        p_Var2 = (&p_Var2->_M_left)[*(cl_accelerator_intel *)(p_Var2 + 1) < accelerator]) {
      if (*(cl_accelerator_intel *)(p_Var2 + 1) >= accelerator) {
        p_Var5 = p_Var2;
      }
    }
    __position._M_node = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
       (__position._M_node = p_Var5, accelerator < *(cl_accelerator_intel *)(p_Var5 + 1))) {
      __position._M_node = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)__position._M_node != p_Var1) {
      p_Var2 = __position._M_node[1]._M_parent;
      p_Var1 = &(this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var9 = &p_Var1->_M_header;
      for (; p_Var5 != (_Base_ptr)0x0;
          p_Var5 = (&p_Var5->_M_left)[*(_Base_ptr *)(p_Var5 + 1) < p_Var2]) {
        if (*(_Base_ptr *)(p_Var5 + 1) >= p_Var2) {
          p_Var9 = p_Var5;
        }
      }
      p_Var5 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var9 != p_Var1) &&
         (p_Var5 = p_Var9, p_Var2 < *(_Base_ptr *)(p_Var9 + 1))) {
        p_Var5 = &p_Var1->_M_header;
      }
      if ((_Rb_tree_header *)p_Var5 == p_Var1) {
        local_50._0_8_ = (key_type)0x0;
        pmVar7 = std::
                 map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
                 ::at(&this->m_DispatchX,(key_type *)local_50);
      }
      else {
        pmVar7 = (mapped_type *)&p_Var5[1]._M_parent;
      }
      if (pmVar7->clGetAcceleratorInfoINTEL ==
          (_func_cl_int_cl_accelerator_intel_cl_accelerator_info_intel_size_t_void_ptr_size_t_ptr *)
          0x0) {
        local_50._0_8_ = local_50 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,"clGetAcceleratorInfoINTEL","");
        getExtensionFunctionAddress(this,(cl_platform_id)p_Var2,(string *)local_50);
        if ((key_type)local_50._0_8_ != (key_type)(local_50 + 0x10)) {
          operator_delete((void *)local_50._0_8_);
        }
      }
      p_Var5 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var9 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var5 != (_Rb_tree_header *)0x0;
          p_Var5 = (&p_Var5->_M_left)[*(_Base_ptr *)(p_Var5 + 1) < p_Var2]) {
        if (*(_Base_ptr *)(p_Var5 + 1) >= p_Var2) {
          p_Var9 = p_Var5;
        }
      }
      p_Var6 = p_Var1;
      if (((_Rb_tree_header *)p_Var9 != p_Var1) &&
         (p_Var6 = (_Rb_tree_header *)p_Var9,
         p_Var2 < (_Base_ptr)((_Rb_tree_header *)p_Var9)->_M_node_count)) {
        p_Var6 = p_Var1;
      }
      if (p_Var6 == p_Var1) {
        local_50._0_8_ = (key_type)0x0;
        pmVar7 = std::
                 map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
                 ::at(&this->m_DispatchX,(key_type *)local_50);
      }
      else {
        pmVar7 = (mapped_type *)(p_Var6 + 1);
      }
      if (pmVar7->clGetAcceleratorInfoINTEL !=
          (_func_cl_int_cl_accelerator_intel_cl_accelerator_info_intel_size_t_void_ptr_size_t_ptr *)
          0x0) {
        local_50._0_8_ = local_50._0_8_ & 0xffffffff00000000;
        cVar4 = (*pmVar7->clGetAcceleratorInfoINTEL)(accelerator,0x4091,4,local_50,(size_t *)0x0);
        if ((cVar4 == 0) && (local_50._0_4_ == 1)) {
          std::
          _Rb_tree<_cl_accelerator_intel*,std::pair<_cl_accelerator_intel*const,_cl_platform_id*>,std::_Select1st<std::pair<_cl_accelerator_intel*const,_cl_platform_id*>>,std::less<_cl_accelerator_intel*>,std::allocator<std::pair<_cl_accelerator_intel*const,_cl_platform_id*>>>
          ::erase_abi_cxx11_((_Rb_tree<_cl_accelerator_intel*,std::pair<_cl_accelerator_intel*const,_cl_platform_id*>,std::_Select1st<std::pair<_cl_accelerator_intel*const,_cl_platform_id*>>,std::less<_cl_accelerator_intel*>,std::allocator<std::pair<_cl_accelerator_intel*const,_cl_platform_id*>>>
                              *)&this->m_AcceleratorInfoMap,__position);
        }
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar8 = std::__throw_system_error(iVar3);
  if ((key_type)local_50._0_8_ != (key_type)(local_50 + 0x10)) {
    operator_delete((void *)local_50._0_8_);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar8);
}

Assistant:

void CLIntercept::checkRemoveAcceleratorInfo(
    cl_accelerator_intel accelerator )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    CAcceleratorInfoMap::iterator iter = m_AcceleratorInfoMap.find( accelerator );
    if( iter != m_AcceleratorInfoMap.end() )
    {
        cl_platform_id  platform = iter->second;
        if( dispatchX(platform).clGetAcceleratorInfoINTEL == NULL )
        {
            getExtensionFunctionAddress(
                platform,
                "clGetAcceleratorInfoINTEL" );
        }

        const auto& dispatchX = this->dispatchX(platform);
        if( dispatchX.clGetAcceleratorInfoINTEL )
        {
            cl_uint refCount = 0;
            cl_int  errorCode = CL_SUCCESS;

            errorCode = dispatchX.clGetAcceleratorInfoINTEL(
                accelerator,
                CL_ACCELERATOR_REFERENCE_COUNT_INTEL,
                sizeof( refCount ),
                &refCount,
                NULL );
            if( errorCode == CL_SUCCESS && refCount == 1 )
            {
                m_AcceleratorInfoMap.erase( iter );
            }
        }
    }
}